

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  ushort uVar5;
  ushort uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  byte bVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  float *pfVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong *puVar40;
  byte bVar41;
  long lVar42;
  undefined1 (*pauVar43) [16];
  NodeRef root;
  undefined4 uVar44;
  ushort uVar45;
  bool bVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  vint4 ai_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint4 bi;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  int iVar98;
  float fVar99;
  float fVar100;
  undefined1 in_ZMM2 [64];
  vint4 bi_3;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 ai;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  vint4 bi_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vint4 ai_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  vint4 ai_3;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar140 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar141 [64];
  Precalculations pre;
  vfloat<8> lower_y;
  vfloat<8> upper_y;
  vfloat<8> upper_x;
  vfloat<8> upper_z;
  vfloat<8> lower_z;
  TravRayK<4,_false> tray;
  vfloat<8> lower_x;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  Precalculations local_39f9;
  long local_39f8;
  uint local_39f0;
  uint local_39ec;
  ulong *local_39e8;
  undefined1 local_39e0 [16];
  undefined1 local_39d0 [16];
  undefined1 local_39c0 [16];
  undefined1 local_39b0 [8];
  float fStack_39a8;
  float fStack_39a4;
  long local_39a0;
  RayK<4> *local_3998;
  ulong local_3990;
  undefined4 local_3984;
  RTCFilterFunctionNArguments local_3980;
  undefined1 local_3950 [16];
  undefined1 local_3940 [16];
  BVH *local_3928;
  undefined1 local_3920 [32];
  undefined1 local_38f0 [16];
  undefined1 local_38e0 [16];
  undefined1 local_38d0 [16];
  undefined1 local_38c0 [16];
  Intersectors *local_38a8;
  long local_38a0;
  long local_3898;
  long local_3890;
  ulong local_3888;
  int local_3880;
  int iStack_387c;
  int iStack_3878;
  int iStack_3874;
  undefined1 local_3870 [16];
  undefined1 local_3860 [16];
  undefined1 local_3850 [16];
  undefined1 local_3840 [16];
  undefined1 local_3830 [16];
  RTCHitN local_3820 [16];
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined1 local_3800 [16];
  undefined1 local_37f0 [16];
  undefined1 local_37e0 [16];
  undefined1 local_37d0 [16];
  undefined1 local_37c0 [16];
  uint local_37b0;
  uint uStack_37ac;
  uint uStack_37a8;
  uint uStack_37a4;
  uint uStack_37a0;
  uint uStack_379c;
  uint uStack_3798;
  uint uStack_3794;
  undefined1 local_3780 [32];
  undefined1 local_3760 [32];
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3740;
  undefined1 local_3710 [16];
  undefined1 local_3700 [16];
  undefined1 local_36f0 [16];
  undefined1 local_36e0 [16];
  undefined1 local_36d0 [16];
  undefined1 local_36c0 [16];
  float local_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  undefined1 local_36a0 [16];
  float local_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  undefined1 local_3680 [16];
  undefined1 local_3670 [16];
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  undefined1 local_3640 [16];
  float local_3630;
  float fStack_362c;
  float fStack_3628;
  float fStack_3624;
  float local_3620;
  float fStack_361c;
  float fStack_3618;
  float fStack_3614;
  float local_3610;
  float fStack_360c;
  float fStack_3608;
  float fStack_3604;
  undefined1 local_3600 [32];
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 local_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 local_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 local_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 local_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 local_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  size_t local_34f8;
  ulong local_34f0 [560];
  undefined1 local_2370 [16];
  undefined1 local_2360 [16];
  undefined1 local_2350 [8992];
  
  local_3928 = (BVH *)This->ptr;
  if ((local_3928->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar51 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      auVar54 = ZEXT816(0) << 0x40;
      uVar14 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar54,5);
      uVar47 = vpcmpeqd_avx512vl(auVar51,(undefined1  [16])valid_i->field_0);
      uVar47 = ((byte)uVar14 & 0xf) & uVar47;
      bVar41 = (byte)uVar47;
      if (bVar41 != 0) {
        local_3740._0_4_ = *(float *)ray;
        local_3740._4_4_ = *(float *)(ray + 4);
        local_3740._8_4_ = *(float *)(ray + 8);
        local_3740._12_4_ = *(float *)(ray + 0xc);
        local_3740._16_4_ = *(float *)(ray + 0x10);
        local_3740._20_4_ = *(float *)(ray + 0x14);
        local_3740._24_4_ = *(float *)(ray + 0x18);
        local_3740._28_4_ = *(float *)(ray + 0x1c);
        local_3740._32_4_ = *(float *)(ray + 0x20);
        local_3740._36_4_ = *(float *)(ray + 0x24);
        local_3740._40_4_ = *(float *)(ray + 0x28);
        local_3740._44_4_ = *(float *)(ray + 0x2c);
        local_3710 = *(undefined1 (*) [16])(ray + 0x40);
        local_3700 = *(undefined1 (*) [16])(ray + 0x50);
        local_36f0 = *(undefined1 (*) [16])(ray + 0x60);
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        local_3984 = (undefined4)uVar47;
        auVar51 = vandps_avx(auVar53,local_3710);
        auVar49._8_4_ = 0x219392ef;
        auVar49._0_8_ = 0x219392ef219392ef;
        auVar49._12_4_ = 0x219392ef;
        uVar37 = vcmpps_avx512vl(auVar51,auVar49,1);
        bVar46 = (bool)((byte)uVar37 & 1);
        auVar50._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3710._0_4_;
        bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3710._4_4_;
        bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3710._8_4_;
        bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3710._12_4_;
        auVar51 = vandps_avx(auVar53,local_3700);
        uVar37 = vcmpps_avx512vl(auVar51,auVar49,1);
        bVar46 = (bool)((byte)uVar37 & 1);
        auVar68._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3700._0_4_;
        bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3700._4_4_;
        bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3700._8_4_;
        bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_3700._12_4_;
        auVar51 = vandps_avx(auVar53,local_36f0);
        uVar37 = vcmpps_avx512vl(auVar51,auVar49,1);
        bVar46 = (bool)((byte)uVar37 & 1);
        auVar70._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_36f0._0_4_;
        bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar70._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_36f0._4_4_;
        bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar70._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_36f0._8_4_;
        bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar70._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * local_36f0._12_4_;
        auVar49 = vrcp14ps_avx512vl(auVar50);
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = &DAT_3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        auVar51 = vfnmadd213ps_fma(auVar50,auVar49,auVar52);
        local_36e0 = vfmadd132ps_fma(auVar51,auVar49,auVar49);
        auVar50 = vrcp14ps_avx512vl(auVar68);
        auVar51 = vfnmadd213ps_fma(auVar68,auVar50,auVar52);
        local_36d0 = vfmadd132ps_fma(auVar51,auVar50,auVar50);
        auVar50 = vrcp14ps_avx512vl(auVar70);
        auVar51 = vfnmadd213ps_fma(auVar70,auVar50,auVar52);
        local_36c0 = vfmadd132ps_fma(auVar51,auVar50,auVar50);
        uVar37 = vcmpps_avx512vl(local_36e0,auVar54,1);
        auVar51 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_3680._4_4_ = (uint)((byte)(uVar37 >> 1) & 1) * auVar51._4_4_;
        local_3680._0_4_ = (uint)((byte)uVar37 & 1) * auVar51._0_4_;
        local_3680._8_4_ = (uint)((byte)(uVar37 >> 2) & 1) * auVar51._8_4_;
        local_3680._12_4_ = (uint)((byte)(uVar37 >> 3) & 1) * auVar51._12_4_;
        uVar37 = vcmpps_avx512vl(local_36d0,auVar54,5);
        auVar51 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar46 = (bool)((byte)uVar37 & 1);
        local_3670._0_4_ = (uint)bVar46 * auVar51._0_4_ | (uint)!bVar46 * 0x60;
        bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
        local_3670._4_4_ = (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * 0x60;
        bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
        local_3670._8_4_ = (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * 0x60;
        bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
        local_3670._12_4_ = (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * 0x60;
        local_36a0._0_4_ = *(float *)(ray + 0x10) * local_36d0._0_4_;
        local_36a0._4_4_ = *(float *)(ray + 0x14) * local_36d0._4_4_;
        local_36a0._8_4_ = *(float *)(ray + 0x18) * local_36d0._8_4_;
        local_36a0._12_4_ = *(float *)(ray + 0x1c) * local_36d0._12_4_;
        uVar37 = vcmpps_avx512vl(local_36c0,auVar54,5);
        auVar51 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar46 = (bool)((byte)uVar37 & 1);
        local_3660._0_4_ = (uint)bVar46 * auVar51._0_4_ | (uint)!bVar46 * 0xa0;
        bVar46 = (bool)((byte)(uVar37 >> 1) & 1);
        local_3660._4_4_ = (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * 0xa0;
        bVar46 = (bool)((byte)(uVar37 >> 2) & 1);
        local_3660._8_4_ = (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * 0xa0;
        bVar46 = (bool)((byte)(uVar37 >> 3) & 1);
        local_3660._12_4_ = (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * 0xa0;
        local_36b0 = *(float *)ray * local_36e0._0_4_;
        fStack_36ac = *(float *)(ray + 4) * local_36e0._4_4_;
        fStack_36a8 = *(float *)(ray + 8) * local_36e0._8_4_;
        fStack_36a4 = *(float *)(ray + 0xc) * local_36e0._12_4_;
        local_3690 = *(float *)(ray + 0x20) * local_36c0._0_4_;
        fStack_368c = *(float *)(ray + 0x24) * local_36c0._4_4_;
        fStack_3688 = *(float *)(ray + 0x28) * local_36c0._8_4_;
        fStack_3684 = *(float *)(ray + 0x2c) * local_36c0._12_4_;
        local_2370 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar138 = ZEXT1664(local_2370);
        auVar51 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar54);
        local_3650._0_4_ =
             (uint)(bVar41 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar41 & 1) * local_2370._0_4_;
        bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
        local_3650._4_4_ = (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * local_2370._4_4_;
        bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
        local_3650._8_4_ = (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * local_2370._8_4_;
        bVar46 = SUB81(uVar47 >> 3,0);
        local_3650._12_4_ = (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * local_2370._12_4_;
        auVar51 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar54);
        local_3640._0_4_ =
             (uint)(bVar41 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar41 & 1) * -0x800000;
        bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
        local_3640._4_4_ = (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * -0x800000;
        bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
        local_3640._8_4_ = (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * -0x800000;
        bVar46 = SUB81(uVar47 >> 3,0);
        local_3640._12_4_ = (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * -0x800000;
        local_38a8 = This;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar37 = 3;
        }
        else {
          uVar37 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
        }
        local_3998 = ray + 0x80;
        uVar45 = (ushort)uVar47 ^ 0xf;
        puVar40 = local_34f0;
        local_3500 = 0xfffffffffffffff8;
        pauVar43 = (undefined1 (*) [16])local_2350;
        local_34f8 = (local_3928->root).ptr;
        local_2360 = local_3650;
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar139 = ZEXT1664(auVar51);
        auVar51 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
        auVar140 = ZEXT1664(auVar51);
        local_3990 = uVar37;
        do {
          pauVar43 = pauVar43 + -1;
          root.ptr = puVar40[-1];
          puVar40 = puVar40 + -1;
          if (root.ptr == 0xfffffffffffffff8) {
LAB_00829ec0:
            iVar30 = 3;
          }
          else {
            _local_39b0 = *pauVar43;
            uVar47 = vcmpps_avx512vl(_local_39b0,local_3640,1);
            if ((char)uVar47 == '\0') {
LAB_00829ef5:
              iVar30 = 2;
            }
            else {
              uVar44 = (undefined4)uVar47;
              iVar30 = 0;
              if ((uint)POPCOUNT(uVar44) <= uVar37) {
                local_39e0 = in_ZMM24._0_16_;
                local_39d0 = in_ZMM23._0_16_;
                local_39c0 = in_ZMM22._0_16_;
                local_39e8 = puVar40;
                do {
                  k = 0;
                  for (uVar37 = uVar47; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    k = k + 1;
                  }
                  bVar46 = occluded1(local_38a8,local_3928,root,k,&local_39f9,ray,
                                     (TravRayK<4,_false> *)&local_3740.field_0,context);
                  bVar41 = (byte)(1 << ((uint)k & 0x1f));
                  if (!bVar46) {
                    bVar41 = 0;
                  }
                  bVar41 = (byte)uVar45 | bVar41;
                  uVar45 = (ushort)bVar41;
                  uVar47 = uVar47 - 1 & uVar47;
                } while (uVar47 != 0);
                uVar45 = (ushort)bVar41;
                if (bVar41 == 0xf) {
                  iVar30 = 3;
                }
                else {
                  auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  local_3640._0_4_ =
                       (uint)(bVar41 & 1) * auVar51._0_4_ |
                       (uint)!(bool)(bVar41 & 1) * local_3640._0_4_;
                  bVar46 = (bool)(bVar41 >> 1 & 1);
                  local_3640._4_4_ = (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * local_3640._4_4_
                  ;
                  bVar46 = (bool)(bVar41 >> 2 & 1);
                  local_3640._8_4_ = (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * local_3640._8_4_
                  ;
                  bVar46 = (bool)(bVar41 >> 3 & 1);
                  local_3640._12_4_ =
                       (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * local_3640._12_4_;
                  iVar30 = 2;
                }
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar138 = ZEXT1664(auVar51);
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar139 = ZEXT1664(auVar51);
                auVar51 = vxorps_avx512vl(auVar140._0_16_,auVar140._0_16_);
                auVar140 = ZEXT1664(auVar51);
                in_ZMM22 = ZEXT1664(local_39c0);
                in_ZMM23 = ZEXT1664(local_39d0);
                in_ZMM24 = ZEXT1664(local_39e0);
                uVar37 = local_3990;
                puVar40 = local_39e8;
              }
              auVar125 = ZEXT1664(_local_39b0);
              if (uVar37 < (uint)POPCOUNT(uVar44)) {
                do {
                  if ((root.ptr & 8) != 0) {
                    if (root.ptr == 0xfffffffffffffff8) goto LAB_00829ec0;
                    uVar14 = vcmpps_avx512vl(auVar125._0_16_,local_3640,9);
                    if ((char)uVar14 != '\0') {
                      bVar41 = (byte)uVar45 & 0xf;
                      local_38a0 = (ulong)((uint)root.ptr & 0xf) - 8;
                      if (local_38a0 != 0) {
                        uVar47 = root.ptr & 0xfffffffffffffff0;
                        bVar41 = bVar41 ^ 0xf;
                        lVar34 = 0;
                        local_39e8 = puVar40;
                        do {
                          local_3898 = lVar34;
                          lVar34 = lVar34 * 0x90;
                          auVar51._8_8_ = 0;
                          auVar51._0_8_ = *(ulong *)(uVar47 + 0x40 + lVar34);
                          auVar54._8_8_ = 0;
                          auVar54._0_8_ = *(ulong *)(uVar47 + 0x48 + lVar34);
                          uVar38 = vpcmpub_avx512vl(auVar51,auVar54,2);
                          if ((char)uVar38 != '\0') {
                            lVar34 = lVar34 + uVar47;
                            uVar38 = uVar38 & 0xff;
                            local_3890 = lVar34;
                            do {
                              lVar33 = 0;
                              for (uVar31 = uVar38; (uVar31 & 1) == 0;
                                  uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                                lVar33 = lVar33 + 1;
                              }
                              auVar66._8_8_ = 0;
                              auVar66._0_8_ = *(ulong *)(lVar34 + 0x40);
                              auVar82 = vpmovzxbd_avx2(auVar66);
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              uVar44 = *(undefined4 *)(lVar34 + 0x7c);
                              auVar87._4_4_ = uVar44;
                              auVar87._0_4_ = uVar44;
                              auVar87._8_4_ = uVar44;
                              auVar87._12_4_ = uVar44;
                              auVar87._16_4_ = uVar44;
                              auVar87._20_4_ = uVar44;
                              auVar87._24_4_ = uVar44;
                              auVar87._28_4_ = uVar44;
                              uVar44 = *(undefined4 *)(lVar34 + 0x70);
                              auVar95._4_4_ = uVar44;
                              auVar95._0_4_ = uVar44;
                              auVar95._8_4_ = uVar44;
                              auVar95._12_4_ = uVar44;
                              auVar95._16_4_ = uVar44;
                              auVar95._20_4_ = uVar44;
                              auVar95._24_4_ = uVar44;
                              auVar95._28_4_ = uVar44;
                              auVar51 = vfmadd213ps_fma(auVar82,auVar87,auVar95);
                              local_3600 = ZEXT1632(auVar51);
                              auVar67._8_8_ = 0;
                              auVar67._0_8_ = *(ulong *)(lVar34 + 0x48);
                              auVar82 = vpmovzxbd_avx2(auVar67);
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              auVar51 = vfmadd213ps_fma(auVar82,auVar87,auVar95);
                              _local_3820 = ZEXT1632(auVar51);
                              auVar57._8_8_ = 0;
                              auVar57._0_8_ = *(ulong *)(lVar34 + 0x50);
                              auVar82 = vpmovzxbd_avx2(auVar57);
                              uVar44 = *(undefined4 *)(lVar34 + 0x80);
                              auVar88._4_4_ = uVar44;
                              auVar88._0_4_ = uVar44;
                              auVar88._8_4_ = uVar44;
                              auVar88._12_4_ = uVar44;
                              auVar88._16_4_ = uVar44;
                              auVar88._20_4_ = uVar44;
                              auVar88._24_4_ = uVar44;
                              auVar88._28_4_ = uVar44;
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              uVar44 = *(undefined4 *)(lVar34 + 0x74);
                              auVar96._4_4_ = uVar44;
                              auVar96._0_4_ = uVar44;
                              auVar96._8_4_ = uVar44;
                              auVar96._12_4_ = uVar44;
                              auVar96._16_4_ = uVar44;
                              auVar96._20_4_ = uVar44;
                              auVar96._24_4_ = uVar44;
                              auVar96._28_4_ = uVar44;
                              auVar51 = vfmadd213ps_fma(auVar82,auVar88,auVar96);
                              auVar82 = ZEXT1632(auVar51);
                              local_3980.valid = (int *)auVar82._0_8_;
                              local_3980.geometryUserPtr = (void *)auVar82._8_8_;
                              local_3980.context = (RTCRayQueryContext *)auVar82._16_8_;
                              local_3980.ray = (RTCRayN *)auVar82._24_8_;
                              auVar58._8_8_ = 0;
                              auVar58._0_8_ = *(ulong *)(lVar34 + 0x58);
                              auVar82 = vpmovzxbd_avx2(auVar58);
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              auVar51 = vfmadd213ps_fma(auVar82,auVar88,auVar96);
                              local_3920 = ZEXT1632(auVar51);
                              auVar59._8_8_ = 0;
                              auVar59._0_8_ = *(ulong *)(lVar34 + 0x60);
                              auVar82 = vpmovzxbd_avx2(auVar59);
                              uVar44 = *(undefined4 *)(lVar34 + 0x84);
                              auVar89._4_4_ = uVar44;
                              auVar89._0_4_ = uVar44;
                              auVar89._8_4_ = uVar44;
                              auVar89._12_4_ = uVar44;
                              auVar89._16_4_ = uVar44;
                              auVar89._20_4_ = uVar44;
                              auVar89._24_4_ = uVar44;
                              auVar89._28_4_ = uVar44;
                              uVar44 = *(undefined4 *)(lVar34 + 0x78);
                              auVar97._4_4_ = uVar44;
                              auVar97._0_4_ = uVar44;
                              auVar97._8_4_ = uVar44;
                              auVar97._12_4_ = uVar44;
                              auVar97._16_4_ = uVar44;
                              auVar97._20_4_ = uVar44;
                              auVar97._24_4_ = uVar44;
                              auVar97._28_4_ = uVar44;
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              auVar51 = vfmadd213ps_fma(auVar82,auVar89,auVar97);
                              local_3760 = ZEXT1632(auVar51);
                              auVar55._8_8_ = 0;
                              auVar55._0_8_ = *(ulong *)(lVar34 + 0x68);
                              auVar82 = vpmovzxbd_avx2(auVar55);
                              auVar82 = vcvtdq2ps_avx(auVar82);
                              auVar51 = vfmadd213ps_fma(auVar82,auVar89,auVar97);
                              local_3780 = ZEXT1632(auVar51);
                              auVar62._4_4_ = fStack_36ac;
                              auVar62._0_4_ = local_36b0;
                              auVar62._8_4_ = fStack_36a8;
                              auVar62._12_4_ = fStack_36a4;
                              uVar31 = (ulong)(uint)((int)lVar33 * 4);
                              uVar44 = *(undefined4 *)(local_3600 + uVar31);
                              auVar105._4_4_ = uVar44;
                              auVar105._0_4_ = uVar44;
                              auVar105._8_4_ = uVar44;
                              auVar105._12_4_ = uVar44;
                              auVar50 = vfmsub132ps_fma(auVar105,auVar62,local_36e0);
                              uVar44 = *(undefined4 *)((long)&local_3980.valid + uVar31);
                              auVar112._4_4_ = uVar44;
                              auVar112._0_4_ = uVar44;
                              auVar112._8_4_ = uVar44;
                              auVar112._12_4_ = uVar44;
                              auVar63._4_4_ = fStack_368c;
                              auVar63._0_4_ = local_3690;
                              auVar63._8_4_ = fStack_3688;
                              auVar63._12_4_ = fStack_3684;
                              uVar44 = *(undefined4 *)(local_3760 + uVar31);
                              auVar120._4_4_ = uVar44;
                              auVar120._0_4_ = uVar44;
                              auVar120._8_4_ = uVar44;
                              auVar120._12_4_ = uVar44;
                              auVar68 = vfmsub132ps_fma(auVar112,local_36a0,local_36d0);
                              auVar70 = vfmsub132ps_fma(auVar120,auVar63,local_36c0);
                              uVar44 = *(undefined4 *)(local_3820 + uVar31);
                              auVar56._4_4_ = uVar44;
                              auVar56._0_4_ = uVar44;
                              auVar56._8_4_ = uVar44;
                              auVar56._12_4_ = uVar44;
                              auVar49 = vfmsub132ps_avx512vl(local_36e0,auVar62,auVar56);
                              uVar44 = *(undefined4 *)(local_3920 + uVar31);
                              auVar60._4_4_ = uVar44;
                              auVar60._0_4_ = uVar44;
                              auVar60._8_4_ = uVar44;
                              auVar60._12_4_ = uVar44;
                              auVar52 = vfmsub132ps_avx512vl(local_36d0,local_36a0,auVar60);
                              uVar44 = *(undefined4 *)(local_3780 + uVar31);
                              auVar61._4_4_ = uVar44;
                              auVar61._0_4_ = uVar44;
                              auVar61._8_4_ = uVar44;
                              auVar61._12_4_ = uVar44;
                              auVar53 = vfmsub132ps_avx512vl(local_36c0,auVar63,auVar61);
                              auVar51 = vpminsd_avx(auVar50,auVar49);
                              auVar54 = vpminsd_avx(auVar68,auVar52);
                              auVar51 = vpmaxsd_avx(auVar51,auVar54);
                              auVar54 = vpminsd_avx(auVar70,auVar53);
                              auVar51 = vpmaxsd_avx(auVar51,auVar54);
                              auVar54 = vpmaxsd_avx(auVar50,auVar49);
                              auVar50 = vpmaxsd_avx(auVar68,auVar52);
                              auVar50 = vpminsd_avx(auVar54,auVar50);
                              auVar54 = vpmaxsd_avx(auVar70,auVar53);
                              auVar54 = vpminsd_avx(auVar50,auVar54);
                              auVar51 = vpmaxsd_avx(auVar51,local_3650);
                              auVar54 = vpminsd_avx(auVar54,local_3640);
                              uVar14 = vpcmpd_avx512vl(auVar51,auVar54,2);
                              if ((bVar41 & (byte)uVar14 & 0xf) == 0) {
                                bVar46 = false;
                              }
                              else {
                                local_3888 = uVar38;
                                uVar5 = *(ushort *)(lVar34 + lVar33 * 8);
                                uVar6 = *(ushort *)(lVar34 + 2 + lVar33 * 8);
                                pGVar7 = (context->scene->geometries).items
                                         [*(uint *)(lVar34 + 0x88)].ptr;
                                lVar39 = *(long *)&pGVar7->field_0x58;
                                lVar8 = *(long *)&pGVar7[1].time_range.upper;
                                lVar33 = (ulong)*(uint *)(lVar34 + 4 + lVar33 * 8) *
                                         pGVar7[1].super_RefCount.refCounter.
                                         super___atomic_base<unsigned_long>._M_i;
                                local_39ec = uVar5 & 0x7fff;
                                local_39f0 = uVar6 & 0x7fff;
                                uVar29 = *(uint *)(lVar39 + 4 + lVar33);
                                uVar38 = (ulong)uVar29;
                                uVar31 = (ulong)(uVar29 * local_39f0 +
                                                *(int *)(lVar39 + lVar33) + local_39ec);
                                p_Var9 = pGVar7[1].intersectionFilterN;
                                puVar1 = (undefined8 *)(lVar8 + (uVar31 + 1) * (long)p_Var9);
                                local_3600._16_8_ = *puVar1;
                                local_3600._24_8_ = puVar1[1];
                                lVar34 = uVar31 + uVar38;
                                puVar1 = (undefined8 *)(lVar8 + lVar34 * (long)p_Var9);
                                local_35d0 = *puVar1;
                                uStack_35c8 = puVar1[1];
                                lVar42 = uVar31 + uVar38 + 1;
                                puVar1 = (undefined8 *)(lVar8 + lVar42 * (long)p_Var9);
                                local_35e0 = *puVar1;
                                uStack_35d8 = puVar1[1];
                                uVar37 = (ulong)(-1 < (short)uVar5);
                                puVar1 = (undefined8 *)
                                         (lVar8 + (uVar31 + uVar37 + 1) * (long)p_Var9);
                                lVar35 = uVar37 + lVar42;
                                puVar2 = (undefined8 *)(lVar8 + lVar35 * (long)p_Var9);
                                local_35a0 = *puVar2;
                                uStack_3598 = puVar2[1];
                                if ((short)uVar6 < 0) {
                                  uVar38 = 0;
                                }
                                puVar2 = (undefined8 *)(lVar8 + (lVar34 + uVar38) * (long)p_Var9);
                                puVar3 = (undefined8 *)(lVar8 + (lVar42 + uVar38) * (long)p_Var9);
                                local_3560 = *puVar3;
                                uStack_3558 = puVar3[1];
                                puVar3 = (undefined8 *)(lVar8 + (uVar38 + lVar35) * (long)p_Var9);
                                auVar51 = vpbroadcastd_avx512vl();
                                auVar125 = ZEXT1664(auVar51);
                                local_3600._0_16_ =
                                     *(undefined1 (*) [16])(lVar8 + (long)p_Var9 * uVar31);
                                local_35c0 = local_3600._16_8_;
                                uStack_35b8 = local_3600._24_8_;
                                local_35b0 = *puVar1;
                                uStack_35a8 = puVar1[1];
                                local_3590 = local_35e0;
                                uStack_3588 = uStack_35d8;
                                local_3580 = local_35d0;
                                uStack_3578 = uStack_35c8;
                                local_3570 = local_35e0;
                                uStack_3568 = uStack_35d8;
                                local_3550 = *puVar2;
                                uStack_3548 = puVar2[1];
                                local_3540 = local_35e0;
                                uStack_3538 = uStack_35d8;
                                local_3530 = local_35a0;
                                uStack_3528 = uStack_3598;
                                local_3520 = *puVar3;
                                uStack_3518 = puVar3[1];
                                local_3510 = local_3560;
                                uStack_3508 = uStack_3558;
                                auVar51 = vpbroadcastd_avx512vl();
                                auVar141 = ZEXT1664(auVar51);
                                pfVar36 = (float *)&uStack_35c8;
                                uVar37 = 0;
                                bVar32 = bVar41;
                                do {
                                  fVar99 = pfVar36[-0xe];
                                  auVar101._4_4_ = fVar99;
                                  auVar101._0_4_ = fVar99;
                                  auVar101._8_4_ = fVar99;
                                  auVar101._12_4_ = fVar99;
                                  fVar100 = pfVar36[-0xd];
                                  auVar106._4_4_ = fVar100;
                                  auVar106._0_4_ = fVar100;
                                  auVar106._8_4_ = fVar100;
                                  auVar106._12_4_ = fVar100;
                                  fVar4 = pfVar36[-0xc];
                                  auVar115._4_4_ = fVar4;
                                  auVar115._0_4_ = fVar4;
                                  auVar115._8_4_ = fVar4;
                                  auVar115._12_4_ = fVar4;
                                  auVar55 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar36[-10]));
                                  auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar36[-9]));
                                  local_39b0._4_4_ = pfVar36[-8];
                                  auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar36[-6]));
                                  auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar36[-5]));
                                  auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar36[-4]));
                                  local_3610 = pfVar36[-2];
                                  local_3620 = pfVar36[-1];
                                  local_3630 = *pfVar36;
                                  auVar51 = vmovdqa64_avx512vl(auVar141._0_16_);
                                  local_3760._0_16_ = auVar51;
                                  auVar105 = auVar125._0_16_;
                                  auVar51 = vmovdqa64_avx512vl(auVar105);
                                  local_3780._0_16_ = auVar51;
                                  auVar51 = vsubss_avx512f(auVar101,auVar55);
                                  fVar90 = auVar51._0_4_;
                                  auVar108._4_4_ = fVar90;
                                  auVar108._0_4_ = fVar90;
                                  auVar108._8_4_ = fVar90;
                                  auVar108._12_4_ = fVar90;
                                  auVar51 = vsubss_avx512f(auVar106,auVar56);
                                  fVar74 = auVar51._0_4_;
                                  auVar121._4_4_ = fVar74;
                                  auVar121._0_4_ = fVar74;
                                  auVar121._8_4_ = fVar74;
                                  auVar121._12_4_ = fVar74;
                                  local_39b0._0_4_ = local_39b0._4_4_;
                                  fStack_39a8 = (float)local_39b0._4_4_;
                                  fStack_39a4 = (float)local_39b0._4_4_;
                                  fVar13 = fVar4 - (float)local_39b0._4_4_;
                                  auVar126._4_4_ = fVar13;
                                  auVar126._0_4_ = fVar13;
                                  auVar126._8_4_ = fVar13;
                                  auVar126._12_4_ = fVar13;
                                  fStack_360c = local_3610;
                                  fStack_3608 = local_3610;
                                  fStack_3604 = local_3610;
                                  fVar99 = local_3610 - fVar99;
                                  auVar137._4_4_ = fVar99;
                                  auVar137._0_4_ = fVar99;
                                  auVar137._8_4_ = fVar99;
                                  auVar137._12_4_ = fVar99;
                                  fStack_361c = local_3620;
                                  fStack_3618 = local_3620;
                                  fStack_3614 = local_3620;
                                  auVar60 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_3620 - fVar100)));
                                  fStack_362c = local_3630;
                                  fStack_3628 = local_3630;
                                  fStack_3624 = local_3630;
                                  auVar61 = vbroadcastss_avx512vl
                                                      (ZEXT416((uint)(local_3630 - fVar4)));
                                  fVar74 = (local_3630 - fVar4) * fVar74;
                                  auVar75._4_4_ = fVar74;
                                  auVar75._0_4_ = fVar74;
                                  auVar75._8_4_ = fVar74;
                                  auVar75._12_4_ = fVar74;
                                  auVar62 = vfmsub231ps_avx512vl(auVar75,auVar60,auVar126);
                                  fVar99 = fVar13 * fVar99;
                                  auVar83._4_4_ = fVar99;
                                  auVar83._0_4_ = fVar99;
                                  auVar83._8_4_ = fVar99;
                                  auVar83._12_4_ = fVar99;
                                  auVar63 = vfmsub231ps_avx512vl(auVar83,auVar61,auVar108);
                                  fVar90 = (local_3620 - fVar100) * fVar90;
                                  auVar91._4_4_ = fVar90;
                                  auVar91._0_4_ = fVar90;
                                  auVar91._8_4_ = fVar90;
                                  auVar91._12_4_ = fVar90;
                                  auVar52 = vfmsub231ps_fma(auVar91,auVar137,auVar121);
                                  auVar68 = vsubps_avx(auVar101,*(undefined1 (*) [16])ray);
                                  auVar70 = vsubps_avx(auVar106,*(undefined1 (*) [16])(ray + 0x10));
                                  auVar49 = vsubps_avx(auVar115,*(undefined1 (*) [16])(ray + 0x20));
                                  auVar51 = *(undefined1 (*) [16])(ray + 0x40);
                                  auVar54 = *(undefined1 (*) [16])(ray + 0x50);
                                  auVar50 = *(undefined1 (*) [16])(ray + 0x60);
                                  auVar132._0_4_ = auVar54._0_4_ * auVar49._0_4_;
                                  auVar132._4_4_ = auVar54._4_4_ * auVar49._4_4_;
                                  auVar132._8_4_ = auVar54._8_4_ * auVar49._8_4_;
                                  auVar132._12_4_ = auVar54._12_4_ * auVar49._12_4_;
                                  auVar53 = vfmsub231ps_fma(auVar132,auVar70,auVar50);
                                  auVar133._0_4_ = auVar50._0_4_ * auVar68._0_4_;
                                  auVar133._4_4_ = auVar50._4_4_ * auVar68._4_4_;
                                  auVar133._8_4_ = auVar50._8_4_ * auVar68._8_4_;
                                  auVar133._12_4_ = auVar50._12_4_ * auVar68._12_4_;
                                  auVar66 = vfmsub231ps_fma(auVar133,auVar49,auVar51);
                                  auVar135._0_4_ = auVar51._0_4_ * auVar70._0_4_;
                                  auVar135._4_4_ = auVar51._4_4_ * auVar70._4_4_;
                                  auVar135._8_4_ = auVar51._8_4_ * auVar70._8_4_;
                                  auVar135._12_4_ = auVar51._12_4_ * auVar70._12_4_;
                                  auVar67 = vfmsub231ps_fma(auVar135,auVar68,auVar54);
                                  auVar116._0_4_ = auVar52._0_4_ * auVar50._0_4_;
                                  auVar116._4_4_ = auVar52._4_4_ * auVar50._4_4_;
                                  auVar116._8_4_ = auVar52._8_4_ * auVar50._8_4_;
                                  auVar116._12_4_ = auVar52._12_4_ * auVar50._12_4_;
                                  auVar54 = vfmadd231ps_fma(auVar116,auVar63,auVar54);
                                  auVar51 = vfmadd231ps_fma(auVar54,auVar62,auVar51);
                                  auVar50 = vandps_avx512vl(auVar51,auVar139._0_16_);
                                  auVar54 = vmulps_avx512vl(auVar61,auVar67);
                                  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar66,auVar60);
                                  auVar54 = vfmadd231ps_fma(auVar54,auVar53,auVar137);
                                  uVar29 = auVar50._0_4_;
                                  auVar107._0_4_ = uVar29 ^ auVar54._0_4_;
                                  uVar129 = auVar50._4_4_;
                                  auVar107._4_4_ = uVar129 ^ auVar54._4_4_;
                                  uVar130 = auVar50._8_4_;
                                  auVar107._8_4_ = uVar130 ^ auVar54._8_4_;
                                  uVar131 = auVar50._12_4_;
                                  auVar107._12_4_ = uVar131 ^ auVar54._12_4_;
                                  auVar54 = auVar140._0_16_;
                                  uVar14 = vcmpps_avx512vl(auVar107,auVar54,5);
                                  bVar28 = (byte)uVar14 & bVar32;
                                  if (bVar28 == 0) {
LAB_00829282:
                                    uVar29 = 0;
                                  }
                                  else {
                                    auVar127._0_4_ = fVar13 * auVar67._0_4_;
                                    auVar127._4_4_ = fVar13 * auVar67._4_4_;
                                    auVar127._8_4_ = fVar13 * auVar67._8_4_;
                                    auVar127._12_4_ = fVar13 * auVar67._12_4_;
                                    auVar50 = vfmadd213ps_fma(auVar66,auVar121,auVar127);
                                    auVar50 = vfmadd213ps_fma(auVar53,auVar108,auVar50);
                                    auVar109._0_4_ = uVar29 ^ auVar50._0_4_;
                                    auVar109._4_4_ = uVar129 ^ auVar50._4_4_;
                                    auVar109._8_4_ = uVar130 ^ auVar50._8_4_;
                                    auVar109._12_4_ = uVar131 ^ auVar50._12_4_;
                                    uVar14 = vcmpps_avx512vl(auVar109,auVar54,5);
                                    bVar28 = bVar28 & (byte)uVar14;
                                    if (bVar28 == 0) goto LAB_00829282;
                                    auVar22._8_4_ = 0x7fffffff;
                                    auVar22._0_8_ = 0x7fffffff7fffffff;
                                    auVar22._12_4_ = 0x7fffffff;
                                    auVar53 = vandps_avx512vl(auVar51,auVar22);
                                    auVar50 = vsubps_avx(auVar53,auVar107);
                                    uVar14 = vcmpps_avx512vl(auVar50,auVar109,5);
                                    bVar28 = bVar28 & (byte)uVar14;
                                    if (bVar28 == 0) goto LAB_00829282;
                                    auVar123._0_4_ = auVar49._0_4_ * auVar52._0_4_;
                                    auVar123._4_4_ = auVar49._4_4_ * auVar52._4_4_;
                                    auVar123._8_4_ = auVar49._8_4_ * auVar52._8_4_;
                                    auVar123._12_4_ = auVar49._12_4_ * auVar52._12_4_;
                                    auVar50 = vfmadd213ps_fma(auVar70,auVar63,auVar123);
                                    auVar50 = vfmadd213ps_fma(auVar68,auVar62,auVar50);
                                    auVar114._0_4_ = auVar53._0_4_ * *(float *)(ray + 0x30);
                                    auVar114._4_4_ = auVar53._4_4_ * *(float *)(ray + 0x34);
                                    auVar114._8_4_ = auVar53._8_4_ * *(float *)(ray + 0x38);
                                    auVar114._12_4_ = auVar53._12_4_ * *(float *)(ray + 0x3c);
                                    auVar102._0_4_ = uVar29 ^ auVar50._0_4_;
                                    auVar102._4_4_ = uVar129 ^ auVar50._4_4_;
                                    auVar102._8_4_ = uVar130 ^ auVar50._8_4_;
                                    auVar102._12_4_ = uVar131 ^ auVar50._12_4_;
                                    auVar124._0_4_ = auVar53._0_4_ * *(float *)(ray + 0x80);
                                    auVar124._4_4_ = auVar53._4_4_ * *(float *)(ray + 0x84);
                                    auVar124._8_4_ = auVar53._8_4_ * *(float *)(ray + 0x88);
                                    auVar124._12_4_ = auVar53._12_4_ * *(float *)(ray + 0x8c);
                                    uVar14 = vcmpps_avx512vl(auVar102,auVar124,2);
                                    uVar15 = vcmpps_avx512vl(auVar114,auVar102,1);
                                    bVar28 = bVar28 & (byte)uVar14 & (byte)uVar15;
                                    if (bVar28 == 0) {
                                      uVar29 = 0;
                                    }
                                    else {
                                      uVar14 = vcmpps_avx512vl(auVar51,ZEXT816(0) << 0x20,4);
                                      bVar28 = bVar28 & (byte)uVar14;
                                      uVar29 = (uint)bVar28;
                                      if (bVar28 != 0) {
                                        in_ZMM22 = ZEXT1664(auVar107);
                                        in_ZMM23 = ZEXT1664(auVar109);
                                        local_38c0 = auVar102;
                                        in_ZMM24 = ZEXT1664(auVar53);
                                        local_38d0 = auVar62;
                                        local_38e0 = auVar63;
                                        local_38f0 = auVar52;
                                      }
                                    }
                                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar138 = ZEXT1664(auVar51);
                                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar139 = ZEXT1664(auVar51);
                                    auVar51 = vxorps_avx512vl(auVar54,auVar54);
                                    auVar140 = ZEXT1664(auVar51);
                                  }
                                  auVar51 = auVar140._0_16_;
                                  bVar28 = (byte)uVar29;
                                  if (bVar28 != 0) {
                                    auVar54 = vcvtsi2ss_avx512f(auVar105,*(ushort *)
                                                                          (lVar39 + 8 + lVar33) - 1)
                                    ;
                                    auVar64._4_12_ = auVar140._4_12_;
                                    auVar64._0_4_ = auVar54._0_4_;
                                    auVar50 = vrcp14ss_avx512f(auVar51,auVar64);
                                    auVar54 = vfnmadd213ss_avx512f
                                                        (auVar54,auVar50,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar99 = auVar50._0_4_ * auVar54._0_4_;
                                    auVar54 = vcvtsi2ss_avx512f(auVar105,*(ushort *)
                                                                          (lVar39 + 10 + lVar33) - 1
                                                               );
                                    auVar65._4_12_ = auVar64._4_12_;
                                    auVar65._0_4_ = auVar54._0_4_;
                                    auVar50 = vrcp14ss_avx512f(auVar51,auVar65);
                                    auVar54 = vfnmadd213ss_avx512f
                                                        (auVar54,auVar50,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar100 = auVar50._0_4_ * auVar54._0_4_;
                                    auVar54 = vcvtsi2ss_avx512f(auVar105,((uint)uVar37 & 1) +
                                                                         local_39ec);
                                    auVar92._0_4_ = auVar54._0_4_;
                                    auVar92._4_4_ = auVar92._0_4_;
                                    auVar92._8_4_ = auVar92._0_4_;
                                    auVar92._12_4_ = auVar92._0_4_;
                                    local_39e0 = in_ZMM24._0_16_;
                                    auVar54 = vmulps_avx512vl(auVar92,local_39e0);
                                    auVar54 = vaddps_avx512vl(in_ZMM22._0_16_,auVar54);
                                    auVar76._4_4_ = fVar99;
                                    auVar76._0_4_ = fVar99;
                                    auVar76._8_4_ = fVar99;
                                    auVar76._12_4_ = fVar99;
                                    auVar54 = vmulps_avx512vl(auVar54,auVar76);
                                    local_39c0._0_4_ =
                                         (uint)(bVar28 & 1) * auVar54._0_4_ |
                                         (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 1) & 1);
                                    local_39c0._4_4_ =
                                         (uint)bVar46 * auVar54._4_4_ |
                                         (uint)!bVar46 * in_ZMM22._4_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 2) & 1);
                                    local_39c0._8_4_ =
                                         (uint)bVar46 * auVar54._8_4_ |
                                         (uint)!bVar46 * in_ZMM22._8_4_;
                                    local_39c0._12_4_ =
                                         (uVar29 >> 3) * auVar54._12_4_ |
                                         (uint)!SUB41(uVar29 >> 3,0) * in_ZMM22._12_4_;
                                    in_ZMM22 = ZEXT1664(local_39c0);
                                    auVar54 = vcvtsi2ss_avx512f(auVar105,((uint)(uVar37 >> 1) &
                                                                         0x7fffffff) + local_39f0);
                                    auVar77._0_4_ = auVar54._0_4_;
                                    auVar77._4_4_ = auVar77._0_4_;
                                    auVar77._8_4_ = auVar77._0_4_;
                                    auVar77._12_4_ = auVar77._0_4_;
                                    auVar54 = vmulps_avx512vl(auVar77,local_39e0);
                                    auVar54 = vaddps_avx512vl(in_ZMM23._0_16_,auVar54);
                                    auVar84._4_4_ = fVar100;
                                    auVar84._0_4_ = fVar100;
                                    auVar84._8_4_ = fVar100;
                                    auVar84._12_4_ = fVar100;
                                    auVar54 = vmulps_avx512vl(auVar54,auVar84);
                                    local_39d0._0_4_ =
                                         (uint)(bVar28 & 1) * auVar54._0_4_ |
                                         (uint)!(bool)(bVar28 & 1) * in_ZMM23._0_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 1) & 1);
                                    local_39d0._4_4_ =
                                         (uint)bVar46 * auVar54._4_4_ |
                                         (uint)!bVar46 * in_ZMM23._4_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 2) & 1);
                                    local_39d0._8_4_ =
                                         (uint)bVar46 * auVar54._8_4_ |
                                         (uint)!bVar46 * in_ZMM23._8_4_;
                                    local_39d0._12_4_ =
                                         (uVar29 >> 3) * auVar54._12_4_ |
                                         (uint)!SUB41(uVar29 >> 3,0) * in_ZMM23._12_4_;
                                    in_ZMM23 = ZEXT1664(local_39d0);
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_3760 + uVar37 * 4)].ptr;
                                    uVar29 = pGVar7->mask;
                                    auVar78._4_4_ = uVar29;
                                    auVar78._0_4_ = uVar29;
                                    auVar78._8_4_ = uVar29;
                                    auVar78._12_4_ = uVar29;
                                    uVar14 = vptestmd_avx512vl(auVar78,*(undefined1 (*) [16])
                                                                        (ray + 0x90));
                                    bVar28 = (byte)uVar14 & 0xf & bVar28;
                                    uVar38 = (ulong)bVar28;
                                    if (bVar28 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar54 = vrcp14ps_avx512vl(local_39e0);
                                        auVar21._8_4_ = 0x3f800000;
                                        auVar21._0_8_ = &DAT_3f8000003f800000;
                                        auVar21._12_4_ = 0x3f800000;
                                        auVar50 = vfnmadd213ps_avx512vl(auVar54,local_39e0,auVar21);
                                        auVar54 = vfmadd132ps_fma(auVar50,auVar54,auVar54);
                                        local_37f0 = vmulps_avx512vl(local_39c0,auVar54);
                                        local_37e0 = vmulps_avx512vl(local_39d0,auVar54);
                                        local_37c0 = vpbroadcastd_avx512vl();
                                        local_37d0 = vpbroadcastd_avx512vl();
                                        uStack_3810 = local_38e0._0_8_;
                                        local_3820 = (RTCHitN  [16])local_38d0;
                                        uStack_3808 = local_38e0._8_8_;
                                        local_3800 = local_38f0;
                                        vpcmpeqd_avx2(ZEXT1632(local_37f0),ZEXT1632(local_37f0));
                                        uStack_37ac = context->user->instID[0];
                                        local_37b0 = uStack_37ac;
                                        uStack_37a8 = uStack_37ac;
                                        uStack_37a4 = uStack_37ac;
                                        uStack_37a0 = context->user->instPrimID[0];
                                        uStack_379c = uStack_37a0;
                                        uStack_3798 = uStack_37a0;
                                        uStack_3794 = uStack_37a0;
                                        local_3880 = *(int *)(ray + 0x80);
                                        iStack_387c = *(int *)(ray + 0x84);
                                        iStack_3878 = *(int *)(ray + 0x88);
                                        iStack_3874 = *(int *)(ray + 0x8c);
                                        auVar54 = vmulps_avx512vl(auVar54,local_38c0);
                                        bVar46 = (bool)(bVar28 >> 1 & 1);
                                        bVar10 = (bool)(bVar28 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar28 & 1) * auVar54._0_4_ |
                                             (uint)!(bool)(bVar28 & 1) * local_3880;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar46 * auVar54._4_4_ |
                                             (uint)!bVar46 * iStack_387c;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar10 * auVar54._8_4_ |
                                             (uint)!bVar10 * iStack_3878;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)(bVar28 >> 3) * auVar54._12_4_ |
                                             (uint)!(bool)(bVar28 >> 3) * iStack_3874;
                                        auVar54 = vpmovm2d_avx512vl((ulong)bVar28);
                                        local_3920._0_16_ = auVar54;
                                        local_3980.geometryUserPtr = pGVar7->userPtr;
                                        local_3980.valid = (int *)local_3920;
                                        local_3980.context = context->user;
                                        local_3980.ray = (RTCRayN *)ray;
                                        local_3980.hit = local_3820;
                                        local_3980.N = 4;
                                        local_3940 = vmovdqa64_avx512vl(auVar105);
                                        local_3950 = vmovdqa64_avx512vl(auVar141._0_16_);
                                        local_3830 = auVar57;
                                        local_3840 = auVar58;
                                        local_3850 = auVar59;
                                        local_3860 = auVar55;
                                        local_3870 = auVar56;
                                        local_39f8 = lVar39;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_39a0 = lVar33;
                                          (*pGVar7->occlusionFilterN)(&local_3980);
                                          auVar54 = vmovdqa64_avx512vl(local_3950);
                                          auVar141 = ZEXT1664(auVar54);
                                          auVar54 = vmovdqa64_avx512vl(local_3940);
                                          auVar125 = ZEXT1664(auVar54);
                                          in_ZMM24 = ZEXT1664(local_39e0);
                                          in_ZMM23 = ZEXT1664(local_39d0);
                                          in_ZMM22 = ZEXT1664(local_39c0);
                                          auVar51 = vxorps_avx512vl(auVar51,auVar51);
                                          auVar140 = ZEXT1664(auVar51);
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar139 = ZEXT1664(auVar51);
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar138 = ZEXT1664(auVar51);
                                          lVar33 = local_39a0;
                                        }
                                        auVar51 = auVar140._0_16_;
                                        uVar38 = vptestmd_avx512vl(local_3920._0_16_,
                                                                   local_3920._0_16_);
                                        uVar38 = uVar38 & 0xf;
                                        if ((char)uVar38 != '\0') {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var9)(&local_3980);
                                            auVar54 = vmovdqa64_avx512vl(local_3950);
                                            auVar141 = ZEXT1664(auVar54);
                                            auVar54 = vmovdqa64_avx512vl(local_3940);
                                            auVar125 = ZEXT1664(auVar54);
                                            in_ZMM24 = ZEXT1664(local_39e0);
                                            in_ZMM23 = ZEXT1664(local_39d0);
                                            in_ZMM22 = ZEXT1664(local_39c0);
                                            auVar51 = vxorps_avx512vl(auVar51,auVar51);
                                            auVar140 = ZEXT1664(auVar51);
                                            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar139 = ZEXT1664(auVar51);
                                            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar138 = ZEXT1664(auVar51);
                                          }
                                          uVar38 = vptestmd_avx512vl(local_3920._0_16_,
                                                                     local_3920._0_16_);
                                          uVar38 = uVar38 & 0xf;
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar46 = (bool)((byte)uVar38 & 1);
                                          bVar10 = (bool)((byte)(uVar38 >> 1) & 1);
                                          bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                          bVar12 = SUB81(uVar38 >> 3,0);
                                          *(uint *)(local_3980.ray + 0x80) =
                                               (uint)bVar46 * auVar51._0_4_ |
                                               (uint)!bVar46 * *(int *)(local_3980.ray + 0x80);
                                          *(uint *)(local_3980.ray + 0x84) =
                                               (uint)bVar10 * auVar51._4_4_ |
                                               (uint)!bVar10 * *(int *)(local_3980.ray + 0x84);
                                          *(uint *)(local_3980.ray + 0x88) =
                                               (uint)bVar11 * auVar51._8_4_ |
                                               (uint)!bVar11 * *(int *)(local_3980.ray + 0x88);
                                          *(uint *)(local_3980.ray + 0x8c) =
                                               (uint)bVar12 * auVar51._12_4_ |
                                               (uint)!bVar12 * *(int *)(local_3980.ray + 0x8c);
                                        }
                                        bVar46 = (bool)((byte)uVar38 & 1);
                                        bVar10 = (bool)((byte)(uVar38 >> 1) & 1);
                                        bVar11 = (bool)((byte)(uVar38 >> 2) & 1);
                                        bVar12 = SUB81(uVar38 >> 3,0);
                                        *(uint *)local_3998 =
                                             (uint)bVar46 * *(int *)local_3998 |
                                             (uint)!bVar46 * local_3880;
                                        *(uint *)(local_3998 + 4) =
                                             (uint)bVar10 * *(int *)(local_3998 + 4) |
                                             (uint)!bVar10 * iStack_387c;
                                        *(uint *)(local_3998 + 8) =
                                             (uint)bVar11 * *(int *)(local_3998 + 8) |
                                             (uint)!bVar11 * iStack_3878;
                                        *(uint *)(local_3998 + 0xc) =
                                             (uint)bVar12 * *(int *)(local_3998 + 0xc) |
                                             (uint)!bVar12 * iStack_3874;
                                        lVar39 = local_39f8;
                                        auVar57 = local_3830;
                                        auVar58 = local_3840;
                                        auVar59 = local_3850;
                                        auVar55 = local_3860;
                                        auVar56 = local_3870;
                                      }
                                      bVar32 = ((byte)uVar38 ^ 0xf) & bVar32;
                                    }
                                  }
                                  auVar27._4_4_ = fStack_360c;
                                  auVar27._0_4_ = local_3610;
                                  auVar27._8_4_ = fStack_3608;
                                  auVar27._12_4_ = fStack_3604;
                                  auVar53 = vsubps_avx512vl(auVar57,auVar27);
                                  auVar26._4_4_ = fStack_361c;
                                  auVar26._0_4_ = local_3620;
                                  auVar26._8_4_ = fStack_3618;
                                  auVar26._12_4_ = fStack_3614;
                                  auVar66 = vsubps_avx512vl(auVar58,auVar26);
                                  auVar25._4_4_ = fStack_362c;
                                  auVar25._0_4_ = local_3630;
                                  auVar25._8_4_ = fStack_3628;
                                  auVar25._12_4_ = fStack_3624;
                                  auVar67 = vsubps_avx512vl(auVar59,auVar25);
                                  auVar55 = vsubps_avx512vl(auVar55,auVar57);
                                  auVar60 = vsubps_avx512vl(auVar56,auVar58);
                                  auVar61 = vsubps_avx512vl(_local_39b0,auVar59);
                                  auVar51 = vmulps_avx512vl(auVar66,auVar61);
                                  auVar68 = vfmsub231ps_fma(auVar51,auVar60,auVar67);
                                  auVar85._0_4_ = auVar67._0_4_ * auVar55._0_4_;
                                  auVar85._4_4_ = auVar67._4_4_ * auVar55._4_4_;
                                  auVar85._8_4_ = auVar67._8_4_ * auVar55._8_4_;
                                  auVar85._12_4_ = auVar67._12_4_ * auVar55._12_4_;
                                  auVar62 = vfmsub231ps_avx512vl(auVar85,auVar61,auVar53);
                                  auVar93._0_4_ = auVar53._0_4_ * auVar60._0_4_;
                                  auVar93._4_4_ = auVar53._4_4_ * auVar60._4_4_;
                                  auVar93._8_4_ = auVar53._8_4_ * auVar60._8_4_;
                                  auVar93._12_4_ = auVar53._12_4_ * auVar60._12_4_;
                                  auVar70 = vfmsub231ps_fma(auVar93,auVar55,auVar66);
                                  auVar57 = vsubps_avx512vl(auVar57,*(undefined1 (*) [16])ray);
                                  auVar58 = vsubps_avx512vl(auVar58,*(undefined1 (*) [16])
                                                                     (ray + 0x10));
                                  auVar59 = vsubps_avx512vl(auVar59,*(undefined1 (*) [16])
                                                                     (ray + 0x20));
                                  auVar51 = *(undefined1 (*) [16])(ray + 0x40);
                                  auVar54 = *(undefined1 (*) [16])(ray + 0x50);
                                  auVar50 = *(undefined1 (*) [16])(ray + 0x60);
                                  auVar49 = vmulps_avx512vl(auVar54,auVar59);
                                  auVar49 = vfmsub231ps_fma(auVar49,auVar58,auVar50);
                                  auVar134._0_4_ = auVar50._0_4_ * auVar57._0_4_;
                                  auVar134._4_4_ = auVar50._4_4_ * auVar57._4_4_;
                                  auVar134._8_4_ = auVar50._8_4_ * auVar57._8_4_;
                                  auVar134._12_4_ = auVar50._12_4_ * auVar57._12_4_;
                                  auVar52 = vfmsub231ps_fma(auVar134,auVar59,auVar51);
                                  auVar136._0_4_ = auVar51._0_4_ * auVar58._0_4_;
                                  auVar136._4_4_ = auVar51._4_4_ * auVar58._4_4_;
                                  auVar136._8_4_ = auVar51._8_4_ * auVar58._8_4_;
                                  auVar136._12_4_ = auVar51._12_4_ * auVar58._12_4_;
                                  auVar63 = vfmsub231ps_avx512vl(auVar136,auVar57,auVar54);
                                  auVar113._0_4_ = auVar70._0_4_ * auVar50._0_4_;
                                  auVar113._4_4_ = auVar70._4_4_ * auVar50._4_4_;
                                  auVar113._8_4_ = auVar70._8_4_ * auVar50._8_4_;
                                  auVar113._12_4_ = auVar70._12_4_ * auVar50._12_4_;
                                  auVar54 = vfmadd231ps_avx512vl(auVar113,auVar62,auVar54);
                                  auVar51 = vfmadd231ps_fma(auVar54,auVar68,auVar51);
                                  auVar54 = vandps_avx512vl(auVar51,auVar139._0_16_);
                                  auVar50 = vmulps_avx512vl(auVar61,auVar63);
                                  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar52,auVar60);
                                  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar55);
                                  auVar50 = vxorps_avx512vl(auVar54,auVar50);
                                  auVar55 = auVar140._0_16_;
                                  uVar14 = vcmpps_avx512vl(auVar50,auVar55,5);
                                  bVar28 = (byte)uVar14 & bVar32;
                                  if (bVar28 == 0) {
LAB_00829463:
                                    uVar29 = 0;
                                  }
                                  else {
                                    auVar128._0_4_ = auVar67._0_4_ * auVar63._0_4_;
                                    auVar128._4_4_ = auVar67._4_4_ * auVar63._4_4_;
                                    auVar128._8_4_ = auVar67._8_4_ * auVar63._8_4_;
                                    auVar128._12_4_ = auVar67._12_4_ * auVar63._12_4_;
                                    auVar52 = vfmadd213ps_fma(auVar52,auVar66,auVar128);
                                    auVar49 = vfmadd213ps_fma(auVar49,auVar53,auVar52);
                                    auVar122._0_4_ = auVar54._0_4_ ^ auVar49._0_4_;
                                    auVar122._4_4_ = auVar54._4_4_ ^ auVar49._4_4_;
                                    auVar122._8_4_ = auVar54._8_4_ ^ auVar49._8_4_;
                                    auVar122._12_4_ = auVar54._12_4_ ^ auVar49._12_4_;
                                    uVar14 = vcmpps_avx512vl(auVar122,auVar55,5);
                                    bVar28 = bVar28 & (byte)uVar14;
                                    if (bVar28 == 0) goto LAB_00829463;
                                    auVar20._8_4_ = 0x7fffffff;
                                    auVar20._0_8_ = 0x7fffffff7fffffff;
                                    auVar20._12_4_ = 0x7fffffff;
                                    auVar52 = vandps_avx512vl(auVar51,auVar20);
                                    auVar49 = vsubps_avx(auVar52,auVar50);
                                    uVar14 = vcmpps_avx512vl(auVar49,auVar122,5);
                                    bVar28 = bVar28 & (byte)uVar14;
                                    if (bVar28 == 0) goto LAB_00829463;
                                    auVar117._0_4_ = auVar70._0_4_ * auVar59._0_4_;
                                    auVar117._4_4_ = auVar70._4_4_ * auVar59._4_4_;
                                    auVar117._8_4_ = auVar70._8_4_ * auVar59._8_4_;
                                    auVar117._12_4_ = auVar70._12_4_ * auVar59._12_4_;
                                    auVar49 = vfmadd213ps_fma(auVar58,auVar62,auVar117);
                                    auVar49 = vfmadd213ps_fma(auVar57,auVar68,auVar49);
                                    auVar110._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x30);
                                    auVar110._4_4_ = auVar52._4_4_ * *(float *)(ray + 0x34);
                                    auVar110._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x38);
                                    auVar110._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x3c);
                                    auVar103._0_4_ = auVar54._0_4_ ^ auVar49._0_4_;
                                    auVar103._4_4_ = auVar54._4_4_ ^ auVar49._4_4_;
                                    auVar103._8_4_ = auVar54._8_4_ ^ auVar49._8_4_;
                                    auVar103._12_4_ = auVar54._12_4_ ^ auVar49._12_4_;
                                    auVar118._0_4_ = auVar52._0_4_ * *(float *)(ray + 0x80);
                                    auVar118._4_4_ = auVar52._4_4_ * *(float *)(ray + 0x84);
                                    auVar118._8_4_ = auVar52._8_4_ * *(float *)(ray + 0x88);
                                    auVar118._12_4_ = auVar52._12_4_ * *(float *)(ray + 0x8c);
                                    uVar14 = vcmpps_avx512vl(auVar103,auVar118,2);
                                    uVar15 = vcmpps_avx512vl(auVar110,auVar103,1);
                                    bVar28 = bVar28 & (byte)uVar14 & (byte)uVar15;
                                    if (bVar28 == 0) {
                                      uVar29 = 0;
                                    }
                                    else {
                                      uVar14 = vcmpps_avx512vl(auVar51,ZEXT816(0) << 0x20,4);
                                      bVar28 = bVar28 & (byte)uVar14;
                                      uVar29 = (uint)bVar28;
                                      if (bVar28 != 0) {
                                        in_ZMM22 = ZEXT1664(auVar50);
                                        in_ZMM23 = ZEXT1664(auVar122);
                                        local_38c0 = auVar103;
                                        in_ZMM24 = ZEXT1664(auVar52);
                                        local_38d0 = auVar68;
                                        local_38e0 = auVar62;
                                        local_38f0 = auVar70;
                                      }
                                    }
                                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar138 = ZEXT1664(auVar51);
                                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar139 = ZEXT1664(auVar51);
                                    auVar51 = vxorps_avx512vl(auVar55,auVar55);
                                    auVar140 = ZEXT1664(auVar51);
                                  }
                                  auVar51 = auVar140._0_16_;
                                  bVar28 = (byte)uVar29;
                                  if (bVar28 != 0) {
                                    local_39e0 = in_ZMM24._0_16_;
                                    auVar50 = vsubps_avx512vl(local_39e0,in_ZMM22._0_16_);
                                    auVar68 = vsubps_avx512vl(local_39e0,in_ZMM23._0_16_);
                                    auVar54 = vcvtsi2ss_avx512f(auVar56,*(ushort *)
                                                                         (lVar39 + 8 + lVar33) - 1);
                                    auVar69._4_12_ = auVar140._4_12_;
                                    auVar69._0_4_ = auVar54._0_4_;
                                    auVar70 = vrcp14ss_avx512f(auVar51,auVar69);
                                    auVar54 = vfnmadd213ss_avx512f
                                                        (auVar54,auVar70,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar99 = auVar70._0_4_ * auVar54._0_4_;
                                    auVar54 = vcvtsi2ss_avx512f(auVar56,*(ushort *)
                                                                         (lVar39 + 10 + lVar33) - 1)
                                    ;
                                    auVar71._4_12_ = auVar69._4_12_;
                                    auVar71._0_4_ = auVar54._0_4_;
                                    auVar70 = vrcp14ss_avx512f(auVar51,auVar71);
                                    auVar54 = vfnmadd213ss_avx512f
                                                        (auVar54,auVar70,
                                                         SUB6416(ZEXT464(0x40000000),0));
                                    fVar100 = auVar70._0_4_ * auVar54._0_4_;
                                    auVar54 = vcvtsi2ss_avx512f(auVar56,((uint)uVar37 & 1) +
                                                                        local_39ec);
                                    auVar94._0_4_ = auVar54._0_4_;
                                    auVar94._4_4_ = auVar94._0_4_;
                                    auVar94._8_4_ = auVar94._0_4_;
                                    auVar94._12_4_ = auVar94._0_4_;
                                    auVar54 = vmulps_avx512vl(auVar94,local_39e0);
                                    auVar54 = vaddps_avx512vl(auVar50,auVar54);
                                    auVar79._4_4_ = fVar99;
                                    auVar79._0_4_ = fVar99;
                                    auVar79._8_4_ = fVar99;
                                    auVar79._12_4_ = fVar99;
                                    auVar54 = vmulps_avx512vl(auVar54,auVar79);
                                    local_39c0._0_4_ =
                                         (uint)(bVar28 & 1) * auVar54._0_4_ |
                                         (uint)!(bool)(bVar28 & 1) * auVar50._0_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 1) & 1);
                                    local_39c0._4_4_ =
                                         (uint)bVar46 * auVar54._4_4_ |
                                         (uint)!bVar46 * auVar50._4_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 2) & 1);
                                    local_39c0._8_4_ =
                                         (uint)bVar46 * auVar54._8_4_ |
                                         (uint)!bVar46 * auVar50._8_4_;
                                    local_39c0._12_4_ =
                                         (uVar29 >> 3) * auVar54._12_4_ |
                                         (uint)!SUB41(uVar29 >> 3,0) * auVar50._12_4_;
                                    in_ZMM22 = ZEXT1664(local_39c0);
                                    auVar54 = vcvtsi2ss_avx512f(auVar56,((uint)(uVar37 >> 1) &
                                                                        0x7fffffff) + local_39f0);
                                    auVar80._0_4_ = auVar54._0_4_;
                                    auVar80._4_4_ = auVar80._0_4_;
                                    auVar80._8_4_ = auVar80._0_4_;
                                    auVar80._12_4_ = auVar80._0_4_;
                                    auVar54 = vmulps_avx512vl(auVar80,local_39e0);
                                    auVar54 = vaddps_avx512vl(auVar68,auVar54);
                                    auVar86._4_4_ = fVar100;
                                    auVar86._0_4_ = fVar100;
                                    auVar86._8_4_ = fVar100;
                                    auVar86._12_4_ = fVar100;
                                    auVar54 = vmulps_avx512vl(auVar54,auVar86);
                                    local_39d0._0_4_ =
                                         (uint)(bVar28 & 1) * auVar54._0_4_ |
                                         (uint)!(bool)(bVar28 & 1) * auVar68._0_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 1) & 1);
                                    local_39d0._4_4_ =
                                         (uint)bVar46 * auVar54._4_4_ |
                                         (uint)!bVar46 * auVar68._4_4_;
                                    bVar46 = (bool)((byte)(uVar29 >> 2) & 1);
                                    local_39d0._8_4_ =
                                         (uint)bVar46 * auVar54._8_4_ |
                                         (uint)!bVar46 * auVar68._8_4_;
                                    local_39d0._12_4_ =
                                         (uVar29 >> 3) * auVar54._12_4_ |
                                         (uint)!SUB41(uVar29 >> 3,0) * auVar68._12_4_;
                                    in_ZMM23 = ZEXT1664(local_39d0);
                                    pGVar7 = (context->scene->geometries).items
                                             [*(uint *)(local_3760 + uVar37 * 4)].ptr;
                                    uVar29 = pGVar7->mask;
                                    auVar81._4_4_ = uVar29;
                                    auVar81._0_4_ = uVar29;
                                    auVar81._8_4_ = uVar29;
                                    auVar81._12_4_ = uVar29;
                                    uVar14 = vptestmd_avx512vl(auVar81,*(undefined1 (*) [16])
                                                                        (ray + 0x90));
                                    bVar28 = (byte)uVar14 & 0xf & bVar28;
                                    uVar38 = (ulong)bVar28;
                                    if (bVar28 != 0) {
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar54 = vrcp14ps_avx512vl(local_39e0);
                                        auVar19._8_4_ = 0x3f800000;
                                        auVar19._0_8_ = &DAT_3f8000003f800000;
                                        auVar19._12_4_ = 0x3f800000;
                                        auVar50 = vfnmadd213ps_avx512vl(auVar54,local_39e0,auVar19);
                                        auVar54 = vfmadd132ps_fma(auVar50,auVar54,auVar54);
                                        local_37f0 = vmulps_avx512vl(local_39c0,auVar54);
                                        local_37e0 = vmulps_avx512vl(local_39d0,auVar54);
                                        local_37c0 = vpbroadcastd_avx512vl();
                                        local_37d0 = vpbroadcastd_avx512vl();
                                        uStack_3810 = local_38e0._0_8_;
                                        local_3820 = (RTCHitN  [16])local_38d0;
                                        uStack_3808 = local_38e0._8_8_;
                                        local_3800 = local_38f0;
                                        vpcmpeqd_avx2(ZEXT1632(local_37f0),ZEXT1632(local_37f0));
                                        uStack_37ac = context->user->instID[0];
                                        local_37b0 = uStack_37ac;
                                        uStack_37a8 = uStack_37ac;
                                        uStack_37a4 = uStack_37ac;
                                        uStack_37a0 = context->user->instPrimID[0];
                                        uStack_379c = uStack_37a0;
                                        uStack_3798 = uStack_37a0;
                                        uStack_3794 = uStack_37a0;
                                        iVar30 = *(int *)(ray + 0x80);
                                        iVar98 = *(int *)(ray + 0x84);
                                        fVar99 = *(float *)(ray + 0x88);
                                        fVar100 = *(float *)(ray + 0x8c);
                                        _local_39b0 = *(undefined1 (*) [16])(ray + 0x80);
                                        auVar54 = vmulps_avx512vl(auVar54,local_38c0);
                                        bVar46 = (bool)(bVar28 >> 1 & 1);
                                        bVar10 = (bool)(bVar28 >> 2 & 1);
                                        *(uint *)(ray + 0x80) =
                                             (uint)(bVar28 & 1) * auVar54._0_4_ |
                                             (uint)!(bool)(bVar28 & 1) * iVar30;
                                        *(uint *)(ray + 0x84) =
                                             (uint)bVar46 * auVar54._4_4_ | (uint)!bVar46 * iVar98;
                                        *(uint *)(ray + 0x88) =
                                             (uint)bVar10 * auVar54._8_4_ |
                                             (uint)!bVar10 * (int)fVar99;
                                        *(uint *)(ray + 0x8c) =
                                             (uint)(bVar28 >> 3) * auVar54._12_4_ |
                                             (uint)!(bool)(bVar28 >> 3) * (int)fVar100;
                                        auVar54 = vpmovm2d_avx512vl((ulong)bVar28);
                                        local_3920._0_16_ = auVar54;
                                        local_3980.geometryUserPtr = pGVar7->userPtr;
                                        local_3980.valid = (int *)local_3920;
                                        local_3980.context = context->user;
                                        local_3980.ray = (RTCRayN *)ray;
                                        local_3980.hit = local_3820;
                                        local_3980.N = 4;
                                        local_3940 = vmovdqa64_avx512vl(auVar125._0_16_);
                                        local_3950 = vmovdqa64_avx512vl(auVar141._0_16_);
                                        local_39f8 = lVar39;
                                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          local_39a0 = lVar33;
                                          (*pGVar7->occlusionFilterN)(&local_3980);
                                          auVar54 = vmovdqa64_avx512vl(local_3950);
                                          auVar141 = ZEXT1664(auVar54);
                                          auVar54 = vmovdqa64_avx512vl(local_3940);
                                          auVar125 = ZEXT1664(auVar54);
                                          in_ZMM24 = ZEXT1664(local_39e0);
                                          in_ZMM23 = ZEXT1664(local_39d0);
                                          in_ZMM22 = ZEXT1664(local_39c0);
                                          auVar51 = vxorps_avx512vl(auVar51,auVar51);
                                          auVar140 = ZEXT1664(auVar51);
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                          auVar139 = ZEXT1664(auVar51);
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                          auVar138 = ZEXT1664(auVar51);
                                          lVar33 = local_39a0;
                                          iVar30 = local_39b0._0_4_;
                                          iVar98 = local_39b0._4_4_;
                                          fVar99 = fStack_39a8;
                                          fVar100 = fStack_39a4;
                                        }
                                        auVar51 = auVar140._0_16_;
                                        uVar38 = vptestmd_avx512vl(local_3920._0_16_,
                                                                   local_3920._0_16_);
                                        uVar38 = uVar38 & 0xf;
                                        if ((char)uVar38 != '\0') {
                                          p_Var9 = context->args->filter;
                                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var9)(&local_3980);
                                            auVar54 = vmovdqa64_avx512vl(local_3950);
                                            auVar141 = ZEXT1664(auVar54);
                                            auVar54 = vmovdqa64_avx512vl(local_3940);
                                            auVar125 = ZEXT1664(auVar54);
                                            in_ZMM24 = ZEXT1664(local_39e0);
                                            in_ZMM23 = ZEXT1664(local_39d0);
                                            in_ZMM22 = ZEXT1664(local_39c0);
                                            auVar51 = vxorps_avx512vl(auVar51,auVar51);
                                            auVar140 = ZEXT1664(auVar51);
                                            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                            auVar139 = ZEXT1664(auVar51);
                                            auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                            auVar138 = ZEXT1664(auVar51);
                                            iVar30 = local_39b0._0_4_;
                                            iVar98 = local_39b0._4_4_;
                                            fVar99 = fStack_39a8;
                                            fVar100 = fStack_39a4;
                                          }
                                          uVar38 = vptestmd_avx512vl(local_3920._0_16_,
                                                                     local_3920._0_16_);
                                          uVar38 = uVar38 & 0xf;
                                          auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                          bVar46 = (bool)((byte)uVar38 & 1);
                                          auVar72._0_4_ =
                                               (uint)bVar46 * auVar51._0_4_ |
                                               (uint)!bVar46 * *(int *)(local_3980.ray + 0x80);
                                          bVar46 = (bool)((byte)(uVar38 >> 1) & 1);
                                          auVar72._4_4_ =
                                               (uint)bVar46 * auVar51._4_4_ |
                                               (uint)!bVar46 * *(int *)(local_3980.ray + 0x84);
                                          bVar46 = (bool)((byte)(uVar38 >> 2) & 1);
                                          auVar72._8_4_ =
                                               (uint)bVar46 * auVar51._8_4_ |
                                               (uint)!bVar46 * *(int *)(local_3980.ray + 0x88);
                                          bVar46 = SUB81(uVar38 >> 3,0);
                                          auVar72._12_4_ =
                                               (uint)bVar46 * auVar51._12_4_ |
                                               (uint)!bVar46 * *(int *)(local_3980.ray + 0x8c);
                                          *(undefined1 (*) [16])(local_3980.ray + 0x80) = auVar72;
                                        }
                                        bVar46 = (bool)((byte)uVar38 & 1);
                                        auVar73._0_4_ =
                                             (uint)bVar46 * *(int *)local_3998 |
                                             (uint)!bVar46 * iVar30;
                                        bVar46 = (bool)((byte)(uVar38 >> 1) & 1);
                                        auVar73._4_4_ =
                                             (uint)bVar46 * *(int *)(local_3998 + 4) |
                                             (uint)!bVar46 * iVar98;
                                        bVar46 = (bool)((byte)(uVar38 >> 2) & 1);
                                        auVar73._8_4_ =
                                             (uint)bVar46 * *(int *)(local_3998 + 8) |
                                             (uint)!bVar46 * (int)fVar99;
                                        bVar46 = SUB81(uVar38 >> 3,0);
                                        auVar73._12_4_ =
                                             (uint)bVar46 * *(int *)(local_3998 + 0xc) |
                                             (uint)!bVar46 * (int)fVar100;
                                        *(undefined1 (*) [16])local_3998 = auVar73;
                                        lVar39 = local_39f8;
                                      }
                                      bVar32 = ((byte)uVar38 ^ 0xf) & bVar32;
                                    }
                                  }
                                  if (bVar32 == 0) break;
                                  pfVar36 = pfVar36 + 0x10;
                                  bVar46 = uVar37 < 3;
                                  uVar37 = uVar37 + 1;
                                } while (bVar46);
                                bVar41 = bVar41 & bVar32;
                                bVar46 = bVar41 == 0;
                                lVar34 = local_3890;
                                uVar38 = local_3888;
                                uVar37 = local_3990;
                                puVar40 = local_39e8;
                              }
                            } while ((!bVar46) && (uVar38 = uVar38 - 1 & uVar38, uVar38 != 0));
                          }
                          lVar34 = local_3898 + 1;
                        } while (lVar34 != local_38a0);
                        bVar41 = ~bVar41 & 0xf;
                      }
                      bVar41 = (byte)uVar45 | bVar41;
                      uVar45 = (ushort)bVar41;
                      if (bVar41 == 0xf) goto LAB_00829ec0;
                      auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      local_3640._0_4_ =
                           (uint)(bVar41 & 1) * auVar51._0_4_ |
                           (uint)!(bool)(bVar41 & 1) * local_3640._0_4_;
                      bVar46 = (bool)(bVar41 >> 1 & 1);
                      local_3640._4_4_ =
                           (uint)bVar46 * auVar51._4_4_ | (uint)!bVar46 * local_3640._4_4_;
                      bVar46 = (bool)(bVar41 >> 2 & 1);
                      local_3640._8_4_ =
                           (uint)bVar46 * auVar51._8_4_ | (uint)!bVar46 * local_3640._8_4_;
                      bVar46 = (bool)(bVar41 >> 3 & 1);
                      local_3640._12_4_ =
                           (uint)bVar46 * auVar51._12_4_ | (uint)!bVar46 * local_3640._12_4_;
                      iVar30 = 0;
                      break;
                    }
                    goto LAB_00829ef5;
                  }
                  auVar125 = ZEXT1664(auVar138._0_16_);
                  uVar47 = 0;
                  uVar38 = 8;
                  do {
                    uVar31 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar47 * 8);
                    if (uVar31 != 8) {
                      auVar23._4_4_ = fStack_36ac;
                      auVar23._0_4_ = local_36b0;
                      auVar23._8_4_ = fStack_36a8;
                      auVar23._12_4_ = fStack_36a4;
                      uVar44 = *(undefined4 *)(root.ptr + 0x40 + uVar47 * 4);
                      auVar104._4_4_ = uVar44;
                      auVar104._0_4_ = uVar44;
                      auVar104._8_4_ = uVar44;
                      auVar104._12_4_ = uVar44;
                      auVar50 = vfmsub132ps_fma(auVar104,auVar23,local_36e0);
                      uVar44 = *(undefined4 *)(root.ptr + 0x80 + uVar47 * 4);
                      auVar111._4_4_ = uVar44;
                      auVar111._0_4_ = uVar44;
                      auVar111._8_4_ = uVar44;
                      auVar111._12_4_ = uVar44;
                      auVar24._4_4_ = fStack_368c;
                      auVar24._0_4_ = local_3690;
                      auVar24._8_4_ = fStack_3688;
                      auVar24._12_4_ = fStack_3684;
                      uVar44 = *(undefined4 *)(root.ptr + 0xc0 + uVar47 * 4);
                      auVar119._4_4_ = uVar44;
                      auVar119._0_4_ = uVar44;
                      auVar119._8_4_ = uVar44;
                      auVar119._12_4_ = uVar44;
                      auVar68 = vfmsub132ps_fma(auVar111,local_36a0,local_36d0);
                      auVar70 = vfmsub132ps_fma(auVar119,auVar24,local_36c0);
                      uVar44 = *(undefined4 *)(root.ptr + 0x60 + uVar47 * 4);
                      auVar16._4_4_ = uVar44;
                      auVar16._0_4_ = uVar44;
                      auVar16._8_4_ = uVar44;
                      auVar16._12_4_ = uVar44;
                      auVar49 = vfmsub132ps_avx512vl(local_36e0,auVar23,auVar16);
                      uVar44 = *(undefined4 *)(root.ptr + 0xa0 + uVar47 * 4);
                      auVar17._4_4_ = uVar44;
                      auVar17._0_4_ = uVar44;
                      auVar17._8_4_ = uVar44;
                      auVar17._12_4_ = uVar44;
                      auVar52 = vfmsub132ps_avx512vl(local_36d0,local_36a0,auVar17);
                      uVar44 = *(undefined4 *)(root.ptr + 0xe0 + uVar47 * 4);
                      auVar18._4_4_ = uVar44;
                      auVar18._0_4_ = uVar44;
                      auVar18._8_4_ = uVar44;
                      auVar18._12_4_ = uVar44;
                      auVar53 = vfmsub132ps_avx512vl(local_36c0,auVar24,auVar18);
                      auVar51 = vpminsd_avx(auVar50,auVar49);
                      auVar54 = vpminsd_avx(auVar68,auVar52);
                      auVar51 = vpmaxsd_avx(auVar51,auVar54);
                      auVar54 = vpminsd_avx(auVar70,auVar53);
                      auVar51 = vpmaxsd_avx(auVar51,auVar54);
                      auVar54 = vpmaxsd_avx(auVar50,auVar49);
                      auVar50 = vpmaxsd_avx(auVar68,auVar52);
                      auVar50 = vpminsd_avx(auVar54,auVar50);
                      auVar54 = vpmaxsd_avx(auVar70,auVar53);
                      auVar50 = vpminsd_avx(auVar50,auVar54);
                      auVar54 = vpmaxsd_avx(auVar51,local_3650);
                      auVar50 = vpminsd_avx(auVar50,local_3640);
                      uVar48 = vpcmpd_avx512vl(auVar54,auVar50,2);
                      uVar48 = uVar48 & 0xf;
                      if ((byte)uVar48 != 0) {
                        auVar54 = vblendmps_avx512vl(auVar138._0_16_,auVar51);
                        bVar46 = (bool)((byte)uVar48 & 1);
                        bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar48 >> 2) & 1);
                        bVar12 = SUB81(uVar48 >> 3,0);
                        if (uVar38 != 8) {
                          *puVar40 = uVar38;
                          puVar40 = puVar40 + 1;
                          *pauVar43 = auVar125._0_16_;
                          pauVar43 = pauVar43 + 1;
                        }
                        auVar125 = ZEXT1664(CONCAT412((uint)bVar12 * auVar54._12_4_ |
                                                      (uint)!bVar12 * auVar51._12_4_,
                                                      CONCAT48((uint)bVar11 * auVar54._8_4_ |
                                                               (uint)!bVar11 * auVar51._8_4_,
                                                               CONCAT44((uint)bVar10 * auVar54._4_4_
                                                                        | (uint)!bVar10 *
                                                                          auVar51._4_4_,
                                                                        (uint)bVar46 * auVar54._0_4_
                                                                        | (uint)!bVar46 *
                                                                          auVar51._0_4_))));
                        uVar38 = uVar31;
                      }
                    }
                  } while ((uVar31 != 8) && (bVar46 = uVar47 < 7, uVar47 = uVar47 + 1, bVar46));
                  iVar30 = 0;
                  if (uVar38 == 8) {
LAB_00828d12:
                    bVar46 = false;
                    iVar30 = 4;
                  }
                  else {
                    uVar14 = vcmpps_avx512vl(auVar125._0_16_,local_3640,9);
                    bVar46 = true;
                    if ((uint)POPCOUNT((int)uVar14) <= uVar37) {
                      *puVar40 = uVar38;
                      puVar40 = puVar40 + 1;
                      *pauVar43 = auVar125._0_16_;
                      pauVar43 = pauVar43 + 1;
                      goto LAB_00828d12;
                    }
                  }
                  root.ptr = uVar38;
                } while (bVar46);
              }
            }
          }
        } while (iVar30 != 3);
        local_3984._0_1_ = (byte)uVar45 & (byte)local_3984;
        bVar46 = (bool)((byte)local_3984 >> 1 & 1);
        bVar10 = (bool)((byte)local_3984 >> 2 & 1);
        bVar11 = (bool)((byte)local_3984 >> 3 & 1);
        *(uint *)local_3998 =
             (uint)((byte)local_3984 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_3984 & 1) * *(int *)local_3998;
        *(uint *)(local_3998 + 4) =
             (uint)bVar46 * -0x800000 | (uint)!bVar46 * *(int *)(local_3998 + 4);
        *(uint *)(local_3998 + 8) =
             (uint)bVar10 * -0x800000 | (uint)!bVar10 * *(int *)(local_3998 + 8);
        *(uint *)(local_3998 + 0xc) =
             (uint)bVar11 * -0x800000 | (uint)!bVar11 * *(int *)(local_3998 + 0xc);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }